

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

HelicsTranslator
helicsFederateRegisterGlobalTranslator
          (HelicsFederate fed,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  string_view endpointType;
  string_view units;
  bool bVar1;
  Translator *pTVar2;
  pointer pTVar3;
  long in_RDX;
  int in_ESI;
  __sv_type _Var4;
  __single_object trans;
  shared_ptr<helics::Federate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  HelicsFederate in_stack_ffffffffffffff38;
  int iVar5;
  Federate *in_stack_ffffffffffffff70;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff78;
  shared_ptr<helics::Federate> *trans_00;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff80;
  shared_ptr<helics::Federate> *fed_00;
  string_view in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  __shared_ptr local_38 [24];
  long local_20;
  int local_14;
  HelicsTranslator local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  getFedSharedPtr(in_stack_ffffffffffffff38,
                  (HelicsError *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
  if (bVar1) {
    std::make_unique<helics::TranslatorObject>();
    std::__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<helics::Federate,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1eb62c);
    iVar5 = local_14;
    if (local_20 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
      in_stack_ffffffffffffffa0 = _Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
    endpointType._M_str = (char *)in_stack_ffffffffffffff80;
    endpointType._M_len = (size_t)in_stack_ffffffffffffff78;
    units._M_str = in_stack_ffffffffffffffa8;
    units._M_len = (size_t)in_stack_ffffffffffffffa0;
    trans_00 = in_stack_ffffffffffffff78;
    fed_00 = in_stack_ffffffffffffff80;
    pTVar2 = helics::Federate::registerGlobalTranslator
                       (in_stack_ffffffffffffff70,iVar5,in_stack_ffffffffffffff88,endpointType,units
                       );
    pTVar3 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eb6da);
    pTVar3->transPtr = pTVar2;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)0x1eb6ed);
    std::shared_ptr<helics::Federate>::operator=
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pTVar3 = std::
             unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
             operator->((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                         *)0x1eb716);
    pTVar3->custom = local_14 == 0;
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)in_stack_ffffffffffffff80,
               (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                *)in_stack_ffffffffffffff78);
    local_8 = federateAddTranslator
                        (fed_00,(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                                 *)trans_00);
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)CONCAT44(local_14,in_stack_ffffffffffffff30));
    std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>::
    ~unique_ptr((unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                 *)CONCAT44(local_14,in_stack_ffffffffffffff30));
  }
  else {
    local_8 = (HelicsTranslator)0x0;
  }
  std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1eb84d);
  return local_8;
}

Assistant:

HelicsTranslator helicsFederateRegisterGlobalTranslator(HelicsFederate fed, HelicsTranslatorTypes type, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto trans = std::make_unique<helics::TranslatorObject>();
        trans->transPtr = &fedObj->registerGlobalTranslator(type, AS_STRING_VIEW(name));
        trans->fedptr = std::move(fedObj);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return federateAddTranslator(fed, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}